

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

byte * __thiscall nuraft::buffer::get_raw(buffer *this,size_t len)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  overflow_error *this_00;
  
  uVar1 = *(uint *)this;
  uVar4 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar4 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar2 = *(uint *)(this + 4);
    if ((ulong)(uVar4 & uVar1) - (ulong)uVar2 < len) goto LAB_00124e1c;
    lVar3 = (ulong)uVar2 + 8;
    *(uint *)(this + 4) = (int)len + uVar2;
  }
  else {
    if ((ulong)(uVar4 & uVar1) - (ulong)(uVar1 >> 0x10) < len) {
LAB_00124e1c:
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error
                (this_00,"insufficient buffer available for a raw byte array");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    lVar3 = (ulong)(uVar1 >> 0x10) + 4;
    *(short *)(this + 2) = (short)(uVar1 >> 0x10) + (short)len;
  }
  return (byte *)(this + lVar3);
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}